

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O0

int32_t icu_63::spanOneBackUTF8(UnicodeSet *set,uint8_t *s,int32_t length)

{
  UBool UVar1;
  int local_30;
  int local_2c;
  uint local_28;
  int32_t i;
  UChar32 c;
  int32_t length_local;
  uint8_t *s_local;
  UnicodeSet *set_local;
  
  local_28 = (uint)s[length + -1];
  i = length;
  _c = s;
  s_local = (uint8_t *)set;
  if ((s[length + -1] & 0x80) == 0) {
    UVar1 = UnicodeSet::contains(set,local_28);
    set_local._4_4_ = -1;
    if (UVar1 != '\0') {
      set_local._4_4_ = 1;
    }
  }
  else {
    local_2c = length + -1;
    local_28 = utf8_prevCharSafeBody_63(s,0,&local_2c,local_28,-3);
    i = i - local_2c;
    UVar1 = UnicodeSet::contains((UnicodeSet *)s_local,local_28);
    if (UVar1 == '\0') {
      local_30 = -i;
    }
    else {
      local_30 = i;
    }
    set_local._4_4_ = local_30;
  }
  return set_local._4_4_;
}

Assistant:

static inline int32_t
spanOneBackUTF8(const UnicodeSet &set, const uint8_t *s, int32_t length) {
    UChar32 c=s[length-1];
    if(U8_IS_SINGLE(c)) {
        return set.contains(c) ? 1 : -1;
    }
    int32_t i=length-1;
    c=utf8_prevCharSafeBody(s, 0, &i, c, -3);
    length-=i;
    return set.contains(c) ? length : -length;
}